

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O0

void IMU_JY61::ParseData(char chr)

{
  undefined7 uVar1;
  tm *__tp;
  char *pcVar2;
  ulong uVar3;
  time_t local_28;
  time_t now;
  undefined8 uStack_18;
  uchar i;
  short sData [4];
  char chr_local;
  
  uVar3 = (ulong)ParseData::chrCnt;
  ParseData::chrCnt = ParseData::chrCnt + '\x01';
  ParseData::chrBuf[uVar3] = chr;
  if (10 < ParseData::chrCnt) {
    sData[3]._1_1_ = chr;
    if ((ParseData::chrBuf[0] == 'U') && ((ParseData::chrBuf[1] & 0x50U) == 0x50)) {
      uStack_18 = CONCAT17(ParseData::chrBuf[9],
                           CONCAT16(ParseData::chrBuf[8],ParseData::chrBuf._2_6_));
      switch(ParseData::chrBuf[1]) {
      case 'Q':
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&a)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe8 + (ulong)now._7_1_ * 2) /
               32768.0) * 16.0;
        }
        time(&local_28);
        __tp = localtime(&local_28);
        pcVar2 = asctime(__tp);
        printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",(double)a,(double)DAT_0010a228,(double)DAT_0010a22c,
               pcVar2);
        break;
      case 'R':
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&w)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe8 + (ulong)now._7_1_ * 2) /
               32768.0) * 2000.0;
        }
        printf("w: %7.3f %7.3f %7.3f\n",(double)w,(double)DAT_0010a234,(double)DAT_0010a238);
        break;
      case 'S':
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&Angle)[now._7_1_] =
               ((float)(int)*(short *)((long)&stack0xffffffffffffffe8 + (ulong)now._7_1_ * 2) /
               32768.0) * 180.0;
        }
        printf("A:%7.3f %7.3f %7.3f\n",(double)Angle,(double)DAT_0010a240,(double)DAT_0010a244);
        break;
      case 'T':
        for (now._7_1_ = 0; now._7_1_ < 3; now._7_1_ = now._7_1_ + 1) {
          (&h)[now._7_1_] =
               (float)(int)*(short *)((long)&stack0xffffffffffffffe8 + (ulong)now._7_1_ * 2);
        }
        printf("h:%4.0f %4.0f %4.0f\n",(double)h,(double)DAT_0010a24c,(double)DAT_0010a250);
      }
      ParseData::chrCnt = '\0';
    }
    else {
      printf("Error:%x %x\r\n",(ulong)(uint)(int)ParseData::chrBuf[0],
             (ulong)(uint)(int)ParseData::chrBuf[1]);
      uVar1 = CONCAT61(ParseData::chrBuf._2_6_,ParseData::chrBuf[1]);
      ParseData::chrBuf[0] = ParseData::chrBuf[1];
      ParseData::chrBuf[1] = (char)ParseData::chrBuf._2_6_;
      ParseData::chrBuf._2_6_ = (undefined6)(CONCAT17(ParseData::chrBuf[8],uVar1) >> 0x10);
      ParseData::chrBuf[8] = ParseData::chrBuf[9];
      ParseData::chrBuf[9] = ParseData::chrBuf[10];
      ParseData::chrCnt = ParseData::chrCnt + 0xff;
    }
  }
  return;
}

Assistant:

void ParseData(char chr)
    {
        static char chrBuf[100];
        static unsigned char chrCnt=0;
        signed short sData[4];
        unsigned char i;

        time_t now;
        chrBuf[chrCnt++]=chr;
        if (chrCnt<11) return;

        if ((chrBuf[0]!=0x55)||((chrBuf[1]&0x50)!=0x50)) {printf("Error:%x %x\r\n",chrBuf[0],chrBuf[1]);memcpy(&chrBuf[0],&chrBuf[1],10);chrCnt--;return;}

        memcpy(&sData[0],&chrBuf[2],8);

        switch(chrBuf[1])
        {
            case 0x51:
                for (i=0;i<3;i++) a[i] = (float)sData[i]/32768.0*16.0;
                time(&now);
                printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",asctime(localtime(&now)),a[0],a[1],a[2]);
                break;
            case 0x52:
                for (i=0;i<3;i++)
                    w[i] = (float)sData[i]/32768.0*2000.0;
                printf("w: %7.3f %7.3f %7.3f\n",w[0],w[1],w[2]);
                break;
            case 0x53:
            {
                for (i=0;i<3;i++)
                    Angle[i] = (float)sData[i]/32768.0*180.0;
                printf("A:%7.3f %7.3f %7.3f\n",Angle[0],Angle[1],Angle[2]);
            }
                break;
            case 0x54:
                for (i=0;i<3;i++) h[i] = (float)sData[i];
                printf("h:%4.0f %4.0f %4.0f\n",h[0],h[1],h[2]);
                break;
        }
        chrCnt=0;
    }